

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O2

RC __thiscall
StatisticsMgr::Register(StatisticsMgr *this,char *psKey,Stat_Operation op,int *piValue)

{
  int iVar1;
  Boolean BVar2;
  int iVar3;
  Statistic *this_00;
  int index;
  int iVar4;
  
  if (psKey == (char *)0x0) {
    return 0x2329;
  }
  if (op != STAT_ADDONE && piValue == (int *)0x0) {
    return 0x2329;
  }
  iVar1 = (this->llStats).iLength;
  this_00 = (Statistic *)0x0;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  for (index = 0; iVar4 = iVar3, iVar3 != index; index = index + 1) {
    this_00 = LinkList<Statistic>::Get(&this->llStats,index);
    BVar2 = Statistic::operator==(this_00,psKey);
    iVar4 = index;
    if (BVar2 != '\0') break;
  }
  if (iVar4 == iVar1) {
    this_00 = (Statistic *)operator_new(0x10);
    Statistic::Statistic(this_00,psKey);
  }
  switch(op) {
  case STAT_ADDONE:
    this_00->iValue = this_00->iValue + 1;
    break;
  case STAT_ADDVALUE:
    this_00->iValue = this_00->iValue + *piValue;
    break;
  case STAT_SETVALUE:
    iVar3 = *piValue;
    goto LAB_001051be;
  case STAT_MULTVALUE:
    iVar3 = this_00->iValue * *piValue;
    goto LAB_001051be;
  case STAT_DIVVALUE:
    iVar3 = this_00->iValue / *piValue;
LAB_001051be:
    this_00->iValue = iVar3;
    break;
  case STAT_SUBVALUE:
    this_00->iValue = this_00->iValue - *piValue;
  }
  if (iVar4 == iVar1) {
    LinkList<Statistic>::Append(&this->llStats,this_00);
    Statistic::~Statistic(this_00);
    operator_delete(this_00);
  }
  return 0;
}

Assistant:

RC StatisticsMgr::Register (const char *psKey, const Stat_Operation op,
      const int *const piValue)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL || (op != STAT_ADDONE && piValue == NULL))
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // Check to see if we found the Stat
   if (i==iCount)
      // We haven't found it so create a new statistic
      // with the key psKey and initial value of 0.
      pStat = new Statistic( psKey );

   // Now perform the operation over the statistic
   switch (op) {
      case STAT_ADDONE:
         pStat->iValue++;
         break;
      case STAT_ADDVALUE:
         pStat->iValue += *piValue;
         break;
      case STAT_SETVALUE:
         pStat->iValue = *piValue;
         break;
      case STAT_MULTVALUE:
         pStat->iValue *= *piValue;
         break;
      case STAT_DIVVALUE:
         pStat->iValue = (int) (pStat->iValue/(*piValue));
         break;
      case STAT_SUBVALUE:
         pStat->iValue -= *piValue;
         break;
   };

   // Finally, if the statistic wasn't in the original list then add it to
   // the list.
   //  JASON:: Confirm that it makes a copy of the object in line 229 of
   //  linkedlist.h.
   if (i==iCount) {
      llStats.Append(*pStat);
      delete pStat;
   }

   return 0;
}